

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

string * __thiscall
spvtools::val::(anonymous_namespace)::GetIdDesc_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Instruction *inst)

{
  uint32_t uVar1;
  Op opcode;
  ostream *poVar2;
  char *pcVar3;
  ostringstream local_190 [8];
  ostringstream ss;
  Instruction *inst_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"ID <");
  uVar1 = Instruction::id((Instruction *)this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,"> (Op");
  opcode = Instruction::opcode((Instruction *)this);
  pcVar3 = spvOpcodeString(opcode);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string GetIdDesc(const Instruction& inst) {
  std::ostringstream ss;
  ss << "ID <" << inst.id() << "> (Op" << spvOpcodeString(inst.opcode()) << ")";
  return ss.str();
}